

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flat_hash_map.hpp
# Opt level: O2

void __thiscall
ska::detailv3::
sherwood_v3_table<std::pair<slang::DiagCode,_slang::DiagnosticSeverity>,_slang::DiagCode,_slang::Hasher<slang::DiagCode>,_ska::detailv3::KeyOrValueHasher<slang::DiagCode,_std::pair<slang::DiagCode,_slang::DiagnosticSeverity>,_slang::Hasher<slang::DiagCode>_>,_std::equal_to<slang::DiagCode>,_ska::detailv3::KeyOrValueEquality<slang::DiagCode,_std::pair<slang::DiagCode,_slang::DiagnosticSeverity>,_std::equal_to<slang::DiagCode>_>,_std::allocator<std::pair<slang::DiagCode,_slang::DiagnosticSeverity>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::DiagCode,_slang::DiagnosticSeverity>_>_>_>
::sherwood_v3_table(sherwood_v3_table<std::pair<slang::DiagCode,_slang::DiagnosticSeverity>,_slang::DiagCode,_slang::Hasher<slang::DiagCode>,_ska::detailv3::KeyOrValueHasher<slang::DiagCode,_std::pair<slang::DiagCode,_slang::DiagnosticSeverity>,_slang::Hasher<slang::DiagCode>_>,_std::equal_to<slang::DiagCode>,_ska::detailv3::KeyOrValueEquality<slang::DiagCode,_std::pair<slang::DiagCode,_slang::DiagnosticSeverity>,_std::equal_to<slang::DiagCode>_>,_std::allocator<std::pair<slang::DiagCode,_slang::DiagnosticSeverity>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::DiagCode,_slang::DiagnosticSeverity>_>_>_>
                    *this,sherwood_v3_table<std::pair<slang::DiagCode,_slang::DiagnosticSeverity>,_slang::DiagCode,_slang::Hasher<slang::DiagCode>,_ska::detailv3::KeyOrValueHasher<slang::DiagCode,_std::pair<slang::DiagCode,_slang::DiagnosticSeverity>,_slang::Hasher<slang::DiagCode>_>,_std::equal_to<slang::DiagCode>,_ska::detailv3::KeyOrValueEquality<slang::DiagCode,_std::pair<slang::DiagCode,_slang::DiagnosticSeverity>,_std::equal_to<slang::DiagCode>_>,_std::allocator<std::pair<slang::DiagCode,_slang::DiagnosticSeverity>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::DiagCode,_slang::DiagnosticSeverity>_>_>_>
                          *other)

{
  sherwood_v3_entry<std::pair<slang::DiagCode,_slang::DiagnosticSeverity>_> *psVar1;
  
  psVar1 = empty_default_table<std::pair<slang::DiagCode,slang::DiagnosticSeverity>>();
  this->entries = psVar1;
  this->num_slots_minus_one = 0;
  this->hash_policy = '?';
  this->max_lookups = '\x03';
  this->_max_load_factor = 0.5;
  this->num_elements = 0;
  swap_pointers(this,other);
  return;
}

Assistant:

sherwood_v3_table(sherwood_v3_table && other) noexcept
        : EntryAlloc(std::move(other)), Hasher(std::move(other)), Equal(std::move(other))
    {
        swap_pointers(other);
    }